

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11InvalidSelfIssuedinhibitPolicyMappingTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section11InvalidSelfIssuedinhibitPolicyMappingTest8
          (Section11InvalidSelfIssuedinhibitPolicyMappingTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11InvalidSelfIssuedinhibitPolicyMappingTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitPolicyMapping1P1CACert",
                               "inhibitPolicyMapping1P1SelfIssuedCACert",
                               "inhibitPolicyMapping1P1subCACert",
                               "inhibitPolicyMapping1P1subsubCACert",
                               "InvalidSelfIssuedinhibitPolicyMappingTest8EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "inhibitPolicyMapping1P1CACRL",
      "inhibitPolicyMapping1P1subCACRL", "inhibitPolicyMapping1P1subsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.8";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}